

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Reflection *pRVar3;
  Descriptor *actual;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  Message **ppMVar5;
  Reflection *local_38;
  Message *result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar3 = Message::GetReflection(message);
  if (this != pRVar3) {
    pDVar4 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,actual,field,"GetMessage");
  }
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetMessage",CPPTYPE_MESSAGE);
  }
  result = (Message *)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message *)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    pDVar4 = FieldDescriptor::message_type(field);
    this_local = (Reflection *)
                 internal::ExtensionSet::GetMessage(this_00,number,pDVar4,(MessageFactory *)result);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if ((!bVar1) || (bVar1 = HasOneofField(this,message,field), bVar1)) {
      ppMVar5 = GetRaw<google::protobuf::Message_const*>(this,message,field);
      local_38 = (Reflection *)*ppMVar5;
      if (local_38 == (Reflection *)0x0) {
        local_38 = (Reflection *)GetDefaultMessageInstance(this,field);
      }
      this_local = local_38;
    }
    else {
      this_local = (Reflection *)GetDefaultMessageInstance(this,field);
    }
  }
  return (Message *)this_local;
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return *GetDefaultMessageInstance(field);
    }
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = GetDefaultMessageInstance(field);
    }
    return *result;
  }
}